

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::divalpha<Ptex::v2_4::PtexHalf>
               (PtexHalf *data,int npixels,int nchannels,int alphachan,float scale)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  float fVar2;
  int i;
  float aval;
  PtexHalf alpha;
  PtexHalf *end;
  int nchandiv;
  int alphaoffset;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  undefined2 local_36;
  int local_34;
  int local_20;
  long local_8;
  
  local_20 = in_ECX;
  local_8 = in_RDI;
  if (in_ECX == 0) {
    local_8 = in_RDI + 2;
    local_20 = in_EDX + -1;
  }
  lVar1 = local_8 + (long)(in_ESI * in_EDX) * 2;
  for (; local_8 != lVar1; local_8 = local_8 + (long)in_EDX * 2) {
    fVar2 = PtexHalf::operator_cast_to_float((PtexHalf *)0x13859e);
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      uVar3 = in_XMM0_Da;
      PtexHalf::operator_cast_to_float((PtexHalf *)0x1385c3);
      for (local_34 = 0; local_34 < local_20; local_34 = local_34 + 1) {
        PtexHalf::operator_cast_to_float((PtexHalf *)0x1385fd);
        PtexHalf::PtexHalf((PtexHalf *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
        *(undefined2 *)(local_8 + (long)local_34 * 2) = local_36;
      }
    }
  }
  return;
}

Assistant:

inline void divalpha(T* data, int npixels, int nchannels, int alphachan, float scale)
    {
        int alphaoffset; // offset to alpha chan from data ptr
        int nchandiv;    // number of channels to alpha-divide
        if (alphachan == 0) {
            // first channel is alpha chan: div the rest of the channels
            data++;
            alphaoffset = -1;
            nchandiv = nchannels - 1;
        }
        else {
            // div all channels up to alpha chan
            alphaoffset = alphachan;
            nchandiv = alphachan;
        }

        for (T* end = data + npixels*nchannels; data != end; data += nchannels) {
            T alpha = data[alphaoffset];
            if (!alpha) continue; // don't divide by zero!
            float aval = scale / (float)alpha;
            for (int i = 0; i < nchandiv; i++)  data[i] = T((float)data[i] * aval);
        }
    }